

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::
StandardColumnWriter<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  TemplatedValidityMask<unsigned_long> *this_00;
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  Allocator *pAVar4;
  InternalException *this_01;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  int64_t extraout_RDX_02;
  int64_t extraout_RDX_03;
  idx_t r;
  undefined8 *puVar5;
  interval_t *value;
  Vector *mask;
  WriteStream *ser;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  interval_t input_02;
  interval_t input_03;
  allocator local_59;
  uint32_t value_index;
  undefined8 uStack_54;
  StandardColumnWriter<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
  *local_38;
  
  mask = input_column;
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState < 10) {
    this_00 = (TemplatedValidityMask<unsigned_long> *)(input_column + 0x28);
    lVar1 = *(long *)(input_column + 0x20);
    switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
    case 0:
      if (*(long *)this_00 != 0) {
        TemplatedWritePlain<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator,false>
                  (input_column,(ColumnWriterStatistics *)chunk_start,chunk_end,(idx_t)this_00,
                   (ValidityMask *)temp_writer,ser);
        return;
      }
      TemplatedWritePlain<duckdb::interval_t,duckdb::ParquetIntervalTargetType,duckdb::ParquetIntervalOperator,true>
                (input_column,(ColumnWriterStatistics *)chunk_start,chunk_end,(idx_t)temp_writer,
                 (ValidityMask *)mask,ser);
      return;
    default:
      goto switchD_002c0339_caseD_1;
    case 5:
      if (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0') {
        puVar5 = (undefined8 *)(chunk_start * 0x10 + lVar1 + 8);
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
          if (bVar2) {
            input_02.micros = extraout_RDX_01;
            input_02._0_8_ = *puVar5;
            _value_index = ParquetIntervalOperator::
                           Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                                     ((ParquetIntervalOperator *)puVar5[-1],input_02);
            DbpEncoder::BeginWrite<duckdb::ParquetIntervalTargetType>
                      ((DbpEncoder *)(page_state_p + 2),temp_writer,
                       (ParquetIntervalTargetType *)&value_index);
            *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
            chunk_start = chunk_start + 1;
            break;
          }
          puVar5 = puVar5 + 2;
        }
      }
      puVar5 = (undefined8 *)(lVar1 + chunk_start * 0x10 + 8);
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar2) {
          input_03.micros = extraout_RDX_03;
          input_03._0_8_ = *puVar5;
          _value_index = ParquetIntervalOperator::
                         Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                                   ((ParquetIntervalOperator *)puVar5[-1],input_03);
          DbpEncoder::WriteValue<duckdb::ParquetIntervalTargetType>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,
                     (ParquetIntervalTargetType *)&value_index);
        }
        puVar5 = puVar5 + 2;
      }
      break;
    case 6:
      if (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0') {
        puVar5 = (undefined8 *)(chunk_start * 0x10 + lVar1 + 8);
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
          if (bVar2) {
            input_00.micros = extraout_RDX_00;
            input_00._0_8_ = *puVar5;
            _value_index = ParquetIntervalOperator::
                           Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                                     ((ParquetIntervalOperator *)puVar5[-1],input_00);
            pAVar4 = (Allocator *)
                     duckdb::BufferAllocator::Get
                               (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)
                                ->context);
            DlbaEncoder::BeginWrite<duckdb::ParquetIntervalTargetType>
                      ((DlbaEncoder *)(page_state_p + 0x909),pAVar4,temp_writer,
                       (ParquetIntervalTargetType *)&value_index);
            *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
            chunk_start = chunk_start + 1;
            break;
          }
          puVar5 = puVar5 + 2;
        }
      }
      puVar5 = (undefined8 *)(lVar1 + chunk_start * 0x10 + 8);
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar2) {
          input_01.micros = extraout_RDX_02;
          input_01._0_8_ = *puVar5;
          _value_index = ParquetIntervalOperator::
                         Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                                   ((ParquetIntervalOperator *)puVar5[-1],input_01);
          DlbaEncoder::WriteValue<duckdb::ParquetIntervalTargetType>
                    ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,
                     (ParquetIntervalTargetType *)&value_index);
        }
        puVar5 = puVar5 + 2;
      }
      break;
    case 8:
      if (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0') {
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
          if (bVar2) {
            value_index._0_1_ =
                 *(data_t *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
            (*(code *)**(undefined8 **)temp_writer)(temp_writer,&value_index,1);
            page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
            page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
            *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
            break;
          }
        }
      }
      value = (interval_t *)(lVar1 + chunk_start * 0x10);
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar2) {
          uVar3 = PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
                  ::GetIndex((PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
                              *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
          value_index = uVar3;
          RleBpEncoder::WriteValue((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,&value_index)
          ;
        }
        value = value + 1;
      }
      break;
    case 9:
      if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
        pAVar4 = (Allocator *)
                 duckdb::BufferAllocator::Get
                           (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                            context);
        BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar4);
        *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
      }
      puVar5 = (undefined8 *)(lVar1 + chunk_start * 0x10 + 8);
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,chunk_start);
        if (bVar2) {
          input.micros = extraout_RDX;
          input._0_8_ = *puVar5;
          _value_index = ParquetIntervalOperator::
                         Operation<duckdb::interval_t,duckdb::ParquetIntervalTargetType>
                                   ((ParquetIntervalOperator *)puVar5[-1],input);
          BssEncoder::WriteValue<duckdb::ParquetIntervalTargetType>
                    ((BssEncoder *)(page_state_p + 0x1215),(ParquetIntervalTargetType *)&value_index
                    );
        }
        puVar5 = puVar5 + 2;
      }
    }
    return;
  }
switchD_002c0339_caseD_1:
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&value_index,"Unknown encoding",&local_59);
  duckdb::InternalException::InternalException(this_01,(string *)&value_index);
  __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}